

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O2

long __thiscall FileReader::Read(FileReader *this,void *buffer,long len)

{
  size_t sVar1;
  
  if (-1 < len) {
    if (len == 0) {
      sVar1 = 0;
    }
    else {
      sVar1 = (this->StartPos - this->FilePos) + this->Length;
      if (this->FilePos + len <= this->Length + this->StartPos) {
        sVar1 = len;
      }
      sVar1 = fread(buffer,1,sVar1,(FILE *)this->File);
      this->FilePos = this->FilePos + sVar1;
    }
    return sVar1;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/files.cpp"
                ,0x8e,"virtual long FileReader::Read(void *, long)");
}

Assistant:

long FileReader::Read (void *buffer, long len)
{
	assert(len >= 0);
	if (len <= 0) return 0;
	if (FilePos + len > StartPos + Length)
	{
		len = Length - FilePos + StartPos;
	}
	len = (long)fread (buffer, 1, len, File);
	FilePos += len;
	return len;
}